

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFanSetSpeedTableMode(zes_fan_handle_t hFan,zes_fan_speed_table_t *speedTable)

{
  zes_pfnFanSetSpeedTableMode_t pfnSetSpeedTableMode;
  ze_result_t result;
  zes_fan_speed_table_t *speedTable_local;
  zes_fan_handle_t hFan_local;
  
  pfnSetSpeedTableMode._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cda0 != (code *)0x0) {
    pfnSetSpeedTableMode._4_4_ = (*DAT_0011cda0)(hFan,speedTable);
  }
  return pfnSetSpeedTableMode._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanSetSpeedTableMode(
        zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
        const zes_fan_speed_table_t* speedTable         ///< [in] A table containing temperature/speed pairs.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetSpeedTableMode = context.zesDdiTable.Fan.pfnSetSpeedTableMode;
        if( nullptr != pfnSetSpeedTableMode )
        {
            result = pfnSetSpeedTableMode( hFan, speedTable );
        }
        else
        {
            // generic implementation
        }

        return result;
    }